

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgidt(fitsfile *fptr,int *imgtype,int *status)

{
  int iVar1;
  char *keyname;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_00185cd1;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ffmaky(fptr,1,status);
  if (fptr->Fptr->hdutype == 0) {
    keyname = "BITPIX";
  }
  else {
    if (fptr->Fptr->compressimg == 0) {
      *status = 0xe9;
      goto LAB_00185cd1;
    }
    keyname = "ZBITPIX";
  }
  ffgky(fptr,0x1f,keyname,imgtype,(char *)0x0,status);
LAB_00185cd1:
  return *status;
}

Assistant:

int ffgidt( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *imgtype,   /* O - image data type                         */
            int  *status)    /* IO - error status                           */
/*
  Get the datatype of the image (= BITPIX keyword for normal image, or
  ZBITPIX for a compressed image)
*/
{
    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    /* reset to beginning of header */
    ffmaky(fptr, 1, status);  /* simply move to beginning of header */

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffgky(fptr, TINT, "BITPIX", imgtype, NULL, status);
    }
    else if ((fptr->Fptr)->compressimg)
    {
        /* this is a binary table containing a compressed image */
        ffgky(fptr, TINT, "ZBITPIX", imgtype, NULL, status);
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}